

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_scale.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  ALLEGRO_COLOR tint;
  _Bool clip_mode;
  int flags;
  _Bool trans_mode;
  _Bool mem_src_mode;
  _Bool wide_mode;
  int mode;
  double k;
  double theta;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *queue;
  int bmp_h;
  int bmp_w;
  ALLEGRO_BITMAP *src_bmp;
  ALLEGRO_BITMAP *mem_bmp;
  ALLEGRO_BITMAP *bmp;
  ALLEGRO_BITMAP *buf;
  ALLEGRO_DISPLAY *dpy;
  int display_h;
  int display_w;
  double local_120;
  long local_118;
  undefined8 local_c8;
  undefined8 local_c0;
  uint local_b4;
  double __x;
  int local_98 [8];
  int local_78;
  int local_74;
  undefined8 local_50;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 0x280;
  local_18 = 0x1e0;
  __x = 0.0;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  local_b4 = 0;
  bVar6 = false;
  uVar7 = al_install_system(0x5020700,atexit);
  if ((uVar7 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_keyboard();
  al_init_image_addon();
  init_platform_specific();
  open_log();
  log_printf("Press \'w\' to toggle wide mode.\n");
  log_printf("Press \'s\' to toggle memory source bitmap.\n");
  log_printf("Press space to toggle drawing to backbuffer or off-screen bitmap.\n");
  log_printf("Press \'t\' to toggle translucency.\n");
  log_printf("Press \'h\' to toggle horizontal flipping.\n");
  log_printf("Press \'v\' to toggle vertical flipping.\n");
  log_printf("Press \'c\' to toggle clipping.\n");
  log_printf("\n");
  local_20 = al_create_display(0x280,0x1e0);
  if (local_20 == 0) {
    abort_example("Unable to set any graphic mode\n");
  }
  local_28 = al_create_bitmap(0x280,0x1e0);
  if (local_28 == 0) {
    abort_example("Unable to create buffer\n\n");
  }
  local_30 = al_load_bitmap("data/mysha.pcx");
  if (local_30 == 0) {
    abort_example("Unable to load image\n");
  }
  al_set_new_bitmap_flags(1);
  local_38 = al_load_bitmap("data/mysha.pcx");
  if (local_38 == 0) {
    abort_example("Unable to load image\n");
  }
  local_44 = al_get_bitmap_width(local_30);
  local_48 = al_get_bitmap_height(local_30);
  uVar8 = al_create_event_queue();
  local_50 = uVar8;
  uVar9 = al_get_keyboard_event_source();
  al_register_event_source(uVar8,uVar9);
  do {
    uVar7 = al_get_next_event(local_50,local_98);
    if (((uVar7 & 1) != 0) && (local_98[0] == 0xb)) {
      if (local_78 == 0x3b) {
        al_destroy_bitmap(local_30);
        al_destroy_bitmap(local_38);
        al_destroy_bitmap();
        close_log(false);
        return 0;
      }
      if (local_74 == 0x20) {
        bVar2 = (bool)(bVar2 ^ 1);
        if (bVar2) {
          log_printf("Drawing to display backbuffer\n");
        }
        else {
          log_printf("Drawing to off-screen buffer\n");
        }
      }
      if (local_74 == 0x77) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      if (local_74 == 0x73) {
        bVar4 = (bool)(bVar4 ^ 1);
        if (bVar4) {
          log_printf("Source is memory bitmap\n");
        }
        else {
          log_printf("Source is display bitmap\n");
        }
      }
      if (local_74 == 0x74) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if (local_74 == 0x68) {
        local_b4 = local_b4 ^ 1;
      }
      if (local_74 == 0x76) {
        local_b4 = local_b4 ^ 2;
      }
      if (local_74 == 99) {
        bVar6 = (bool)(bVar6 ^ 1);
      }
    }
    if (bVar2) {
      al_set_target_backbuffer(local_20);
    }
    else {
      al_set_target_bitmap(local_28);
    }
    if (bVar4) {
      local_118 = local_38;
    }
    else {
      local_118 = local_30;
    }
    local_40 = local_118;
    local_120 = 2.0;
    if (!bVar3) {
      local_120 = 1.0;
    }
    al_set_blender(0,1);
    local_c0 = 0x3f800000;
    local_c8 = al_map_rgba_f(0x3f800000);
    if (bVar2) {
      uVar9 = 0;
      uVar8 = al_map_rgba_f(0,0,0x3f800000);
      al_clear_to_color(uVar8,uVar9);
    }
    else {
      uVar9 = 0;
      uVar8 = al_map_rgba_f(0x3f800000);
      al_clear_to_color(uVar8,uVar9);
    }
    if (bVar5) {
      al_set_blender(0,2,3);
      local_c0 = 0x3f800000;
      local_c8 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3f000000);
    }
    if (bVar6) {
      al_set_clipping_rectangle(0x32,0x32,0x21c,0x17c);
    }
    else {
      al_set_clipping_rectangle(0,0,0x280,0x1e0);
    }
    lVar1 = local_40;
    fVar10 = (float)local_44;
    fVar11 = (float)local_48;
    dVar13 = cos(__x);
    fVar12 = (float)(local_120 * dVar13 * 640.0 * 0.5);
    dVar13 = sin(__x);
    fVar14 = (float)(local_120 * dVar13 * 480.0 * 0.5);
    al_draw_tinted_scaled_bitmap
              (local_c8,local_c0,0,0,fVar10,fVar11,0x43a00000,0x43700000,lVar1,local_b4);
    if (!bVar2) {
      al_set_target_backbuffer(local_20);
      al_set_clipping_rectangle(0,0,0x280,0x1e0,in_R8,in_R9,fVar12,fVar14);
      al_set_blender(0,1);
      al_draw_bitmap(0,local_28,0);
    }
    al_flip_display();
    al_rest(0x3f847ae147ae147b);
    __x = __x + 0.01;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   const int display_w = 640;
   const int display_h = 480;

   ALLEGRO_DISPLAY *dpy;
   ALLEGRO_BITMAP *buf;
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_BITMAP *mem_bmp;
   ALLEGRO_BITMAP *src_bmp;
   int bmp_w;
   int bmp_h;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   double theta = 0;
   double k = 1.0;
   int mode = 0;
   bool wide_mode = false;
   bool mem_src_mode = false;
   bool trans_mode = false;
   int flags = 0;
   bool clip_mode = false;
   ALLEGRO_COLOR tint;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_init_image_addon();
   init_platform_specific();

   open_log();
   log_printf("Press 'w' to toggle wide mode.\n");
   log_printf("Press 's' to toggle memory source bitmap.\n");
   log_printf("Press space to toggle drawing to backbuffer or off-screen bitmap.\n");
   log_printf("Press 't' to toggle translucency.\n");
   log_printf("Press 'h' to toggle horizontal flipping.\n");
   log_printf("Press 'v' to toggle vertical flipping.\n");
   log_printf("Press 'c' to toggle clipping.\n");
   log_printf("\n");

   dpy = al_create_display(display_w, display_h);
   if (!dpy) {
      abort_example("Unable to set any graphic mode\n");
   }

   buf = al_create_bitmap(display_w, display_h);
   if (!buf) {
      abort_example("Unable to create buffer\n\n");
   }

   bmp = al_load_bitmap("data/mysha.pcx");
   if (!bmp) {
      abort_example("Unable to load image\n");
   }

   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   mem_bmp = al_load_bitmap("data/mysha.pcx");
   if (!mem_bmp) {
      abort_example("Unable to load image\n");
   }

   bmp_w = al_get_bitmap_width(bmp);
   bmp_h = al_get_bitmap_height(bmp);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   while (true) {
      if (al_get_next_event(queue, &event)) {
         if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               break;
            if (event.keyboard.unichar == ' ') {
               mode = !mode;
               if (mode == 0)
                  log_printf("Drawing to off-screen buffer\n");
               else
                  log_printf("Drawing to display backbuffer\n");
            }
            if (event.keyboard.unichar == 'w')
               wide_mode = !wide_mode;
            if (event.keyboard.unichar == 's') {
               mem_src_mode = !mem_src_mode;
               if (mem_src_mode)
                  log_printf("Source is memory bitmap\n");
               else
                  log_printf("Source is display bitmap\n");
            }
            if (event.keyboard.unichar == 't')
               trans_mode = !trans_mode;
            if (event.keyboard.unichar == 'h')
               flags ^= ALLEGRO_FLIP_HORIZONTAL;
            if (event.keyboard.unichar == 'v')
               flags ^= ALLEGRO_FLIP_VERTICAL;
            if (event.keyboard.unichar == 'c')
               clip_mode = !clip_mode;
         }
      }

      /*
       * mode 0 = draw scaled to off-screen buffer before
       *          blitting to display backbuffer
       * mode 1 = draw scaled to display backbuffer
       */

      if (mode == 0) {
         al_set_target_bitmap(buf);
      }
      else {
         al_set_target_backbuffer(dpy);
      }

      src_bmp = (mem_src_mode) ? mem_bmp : bmp;
      k = (wide_mode) ? 2.0 : 1.0;

      al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
      tint = al_map_rgba_f(1, 1, 1, 1);
      if (mode == 0)
         al_clear_to_color(al_map_rgba_f(1, 0, 0, 1));
      else
         al_clear_to_color(al_map_rgba_f(0, 0, 1, 1));

      if (trans_mode) {
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_INVERSE_ALPHA);
         tint = al_map_rgba_f(1, 1, 1, 0.5);
      }

      if (clip_mode) {
         al_set_clipping_rectangle(50, 50, display_w - 100, display_h - 100);
      }
      else {
         al_set_clipping_rectangle(0, 0, display_w, display_h);
      }

      al_draw_tinted_scaled_bitmap(src_bmp, tint,
         0, 0, bmp_w, bmp_h,
         display_w/2, display_h/2,
         k * cos(theta) * display_w/2, k * sin(theta) * display_h/2,
         flags);

      if (mode == 0) {
         al_set_target_backbuffer(dpy);
         al_set_clipping_rectangle(0, 0, display_w, display_h);
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
         al_draw_bitmap(buf, 0, 0, 0);
      }

      al_flip_display();
      al_rest(0.01);
      theta += 0.01;
   }

   al_destroy_bitmap(bmp);
   al_destroy_bitmap(mem_bmp);
   al_destroy_bitmap(buf);

   close_log(false);
   return 0;
}